

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createCompositeConstruct
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents
          )

{
  uint *puVar1;
  uint *__first1;
  bool bVar2;
  uint uVar3;
  Id IVar4;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  uint *in_RCX;
  size_t c;
  long lVar5;
  Op OVar6;
  long lVar7;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __it;
  Builder *local_40;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  bVar2 = isAggregateType(this,typeId);
  if (!bVar2) {
    uVar3 = getNumTypeConstituents(this,typeId);
    if (1 < uVar3) {
      uVar3 = getNumTypeConstituents(this,typeId);
      in_RCX = (uint *)((long)(constituents->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(constituents->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2);
      if (in_RCX == (uint *)(ulong)uVar3) goto LAB_00362307;
    }
    if (((this->module).idToInstruction.
         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
         super__Vector_impl_data._M_start[typeId]->opCode != OpTypeCooperativeVectorNV) ||
       ((long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start != 4)) {
      __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == constituents.size()) || (isCooperativeVectorType(typeId) && constituents.size() == 1)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd89,"Id spv::Builder::createCompositeConstruct(Id, const std::vector<Id> &)")
      ;
    }
  }
LAB_00362307:
  if (this->generatingOpCodeForSpecConst != true) {
    puVar1 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    __first1 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)__first1 - (long)puVar1 >> 2;
    OVar6 = OpCompositeConstruct;
    if ((this->useReplicatedComposites != false) ||
       ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[typeId]->opCode == OpTypeCooperativeVectorNV)) {
      if (__first1 == puVar1) {
        lVar5 = 0;
      }
      else {
        bVar2 = std::__equal<true>::equal<unsigned_int>
                          ((__equal<true> *)(puVar1 + 1),__first1,puVar1,in_RCX);
        if (bVar2) {
          addCapability(this,CapabilityReplicatedCompositesEXT);
          addExtension(this,"SPV_EXT_replicated_composites");
          lVar5 = 1;
          OVar6 = OpCompositeConstructReplicateEXT;
        }
      }
    }
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         ::operator_new(0x60);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_0089f058;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar4;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OVar6;
    (((_Bit_iterator *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
    super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    (((vector<bool,_std::allocator<bool>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
    super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
    *(_Bit_pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) =
         (_Bit_pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
    Instruction::reserveOperands
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
               (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 2);
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      Instruction::addIdOperand
                ((Instruction *)
                 this_00.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
                 (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar7]);
    }
    local_38._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_38);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    return *(Id *)((long)this_00.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  }
  __it._M_current =
       (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  puVar1 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar1 - (long)__it._M_current;
  local_40 = this;
  for (lVar7 = lVar5 >> 4; 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
            ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                          *)&local_40,__it);
    _Var8._M_current = __it._M_current;
    if (bVar2) goto LAB_0036253b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
            ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                          *)&local_40,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )(__it._M_current + 1));
    _Var8._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0036253b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
            ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                          *)&local_40,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )(__it._M_current + 2));
    _Var8._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0036253b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
            ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                          *)&local_40,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )(__it._M_current + 3));
    _Var8._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0036253b;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x10;
  }
  lVar5 = lVar5 >> 2;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var8._M_current = puVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
                  ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                                *)&local_40,__it), _Var8._M_current = __it._M_current, bVar2))
      goto LAB_0036253b;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
            ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                          *)&local_40,__it);
    _Var8._M_current = __it._M_current;
    if (bVar2) goto LAB_0036253b;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::$_0>
          ::operator()((_Iter_pred<spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                        *)&local_40,__it);
  _Var8._M_current = __it._M_current;
  if (!bVar2) {
    _Var8._M_current = puVar1;
  }
LAB_0036253b:
  IVar4 = makeCompositeConstant(this,typeId,constituents,_Var8._M_current != puVar1);
  return IVar4;
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const std::vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 &&
           getNumTypeConstituents(typeId) == constituents.size()) ||
           (isCooperativeVectorType(typeId) && constituents.size() == 1));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    bool replicate = false;
    size_t numConstituents = constituents.size();

    if (useReplicatedComposites || isCooperativeVectorType(typeId)) {
        replicate = numConstituents > 0 &&
            std::equal(constituents.begin() + 1, constituents.end(), constituents.begin());
    }

    if (replicate) {
        numConstituents = 1;
        addCapability(spv::CapabilityReplicatedCompositesEXT);
        addExtension(spv::E_SPV_EXT_replicated_composites);
    }

    Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

    Instruction* op = new Instruction(getUniqueId(), typeId, opcode);
    op->reserveOperands(constituents.size());
    for (size_t c = 0; c < numConstituents; ++c)
        op->addIdOperand(constituents[c]);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}